

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O2

LY_ERR parse_any(lysp_yang_ctx *ctx,ly_stmt any_kw,lysp_node *parent,lysp_node **siblings)

{
  lysp_node *plVar1;
  LY_ERR LVar2;
  lysp_node *parent_00;
  lysp_node *plVar3;
  char *pcVar4;
  char *pcVar5;
  char **ppcVar6;
  lysp_restr **extraout_RDX;
  lysp_restr **extraout_RDX_00;
  lysp_restr **restrs;
  lysp_restr **extraout_RDX_01;
  lysp_restr **extraout_RDX_02;
  ly_ctx *plVar7;
  lysp_ext_instance **exts;
  ly_stmt lVar8;
  bool bVar9;
  lysp_ext_instance **in_stack_ffffffffffffff70;
  ly_stmt kw;
  lysp_ext_instance **local_80;
  char *word;
  size_t word_len;
  uint16_t *local_68;
  char **local_60;
  lysp_qname **local_58;
  lysp_node *local_50;
  char **local_48;
  uint16_t *local_40;
  char *buf;
  
  parent_00 = (lysp_node *)calloc(1,0x50);
  if (parent_00 == (lysp_node *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar7 = (ly_ctx *)0x0;
    }
    else {
      plVar7 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = LY_EMEM;
    ly_log(plVar7,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_any");
  }
  else {
    plVar1 = *siblings;
    if (*siblings != (lysp_node *)0x0) {
      do {
        plVar3 = plVar1;
        plVar1 = plVar3->next;
      } while (plVar1 != (lysp_node *)0x0);
      siblings = &plVar3->next;
    }
    *siblings = parent_00;
    parent_00->nodetype = (ushort)(any_kw == LY_STMT_ANYDATA) << 6 | 0x20;
    parent_00->parent = parent;
    exts = (lysp_ext_instance **)&buf;
    LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&word,(char **)exts,&word_len);
    if (LVar2 == LY_SUCCESS) {
      if (buf == (char *)0x0) {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        pcVar4 = word;
        if (word_len == 0) {
          pcVar4 = "";
        }
        LVar2 = lydict_insert(plVar7,pcVar4,word_len,&parent_00->name);
      }
      else {
        if (ctx == (lysp_yang_ctx *)0x0) {
          plVar7 = (ly_ctx *)0x0;
        }
        else {
          plVar7 = (ly_ctx *)
                   **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        LVar2 = lydict_insert_zc(plVar7,word,&parent_00->name);
      }
      if ((LVar2 == LY_SUCCESS) &&
         (LVar2 = get_keyword(ctx,&kw,&word,&word_len), LVar2 == LY_SUCCESS)) {
        if (kw == LY_STMT_SYNTAX_SEMICOLON) {
          bVar9 = false;
          restrs = extraout_RDX;
        }
        else {
          if (kw != LY_STMT_SYNTAX_LEFT_BRACE) {
            if (ctx == (lysp_yang_ctx *)0x0) {
              plVar7 = (ly_ctx *)0x0;
            }
            else {
              plVar7 = (ly_ctx *)
                       **(undefined8 **)
                         (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
            }
            pcVar4 = lyplg_ext_stmt2str(kw);
            ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                    "Invalid keyword \"%s\", expected \";\" or \"{\".",pcVar4);
            return LY_EVALID;
          }
          LVar2 = get_keyword(ctx,&kw,&word,&word_len);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
          restrs = extraout_RDX_00;
        }
        local_80 = &parent_00->exts;
        local_40 = &parent_00[1].nodetype;
        local_68 = &parent_00->flags;
        local_48 = &parent_00->ref;
        local_50 = parent_00 + 1;
        local_58 = &parent_00->iffeatures;
        local_60 = &parent_00->dsc;
        lVar8 = kw;
        do {
          if (!bVar9) {
            return LY_SUCCESS;
          }
          if (lVar8 == LY_STMT_WHEN) {
            LVar2 = parse_when(ctx,(lysp_when **)local_40);
          }
          else if (lVar8 == LY_STMT_DESCRIPTION) {
            pcVar4 = *local_60;
            lVar8 = LY_STMT_DESCRIPTION;
            ppcVar6 = local_60;
LAB_0016c735:
            exts = (lysp_ext_instance **)0x2;
            LVar2 = parse_text_field(ctx,pcVar4,lVar8,(uint32_t)ppcVar6,(char **)0x2,Y_IDENTIF_ARG,
                                     (uint16_t *)local_80,in_stack_ffffffffffffff70);
          }
          else if (lVar8 == LY_STMT_EXTENSION_INSTANCE) {
            exts = (lysp_ext_instance **)(ulong)any_kw;
            LVar2 = parse_ext(ctx,word,word_len,parent_00,any_kw,0,local_80);
          }
          else if (lVar8 == LY_STMT_IF_FEATURE) {
            LVar2 = parse_qnames(ctx,LY_STMT_IF_FEATURE,local_58,(yang_arg)local_80,exts);
          }
          else if (lVar8 == LY_STMT_MANDATORY) {
            LVar2 = parse_mandatory(ctx,local_68,local_80);
          }
          else if (lVar8 == LY_STMT_MUST) {
            LVar2 = parse_restrs(ctx,(ly_stmt)local_50,restrs);
          }
          else {
            if (lVar8 == LY_STMT_REFERENCE) {
              pcVar4 = *local_48;
              lVar8 = LY_STMT_REFERENCE;
              ppcVar6 = local_48;
              goto LAB_0016c735;
            }
            if (lVar8 == LY_STMT_STATUS) {
              LVar2 = parse_status(ctx,local_68,local_80);
            }
            else {
              if (lVar8 != LY_STMT_CONFIG) {
                if (ctx == (lysp_yang_ctx *)0x0) {
                  plVar7 = (ly_ctx *)0x0;
                }
                else {
                  plVar7 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar4 = lyplg_ext_stmt2str(lVar8);
                pcVar5 = lyplg_ext_stmt2str(any_kw);
                ly_vlog(plVar7,(char *)0x0,LYVE_SYNTAX_YANG,
                        "Invalid keyword \"%s\" as a child of \"%s\".",pcVar4,pcVar5);
                return LY_EVALID;
              }
              LVar2 = parse_config(ctx,local_68,local_80);
            }
          }
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          LVar2 = get_keyword(ctx,&kw,&word,&word_len);
          lVar8 = kw;
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          bVar9 = kw != LY_STMT_SYNTAX_RIGHT_BRACE;
          restrs = extraout_RDX_01;
          if (((!bVar9) && (*local_80 != (lysp_ext_instance *)0x0)) &&
             (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*local_80,'\x01',(uint32_t *)0x0),
             restrs = extraout_RDX_02, LVar2 != LY_SUCCESS)) {
            return LVar2;
          }
        } while( true );
      }
    }
  }
  return LVar2;
}

Assistant:

LY_ERR
parse_any(struct lysp_yang_ctx *ctx, enum ly_stmt any_kw, struct lysp_node *parent, struct lysp_node **siblings)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    struct lysp_node_anydata *any;
    enum ly_stmt kw;

    /* create new structure and insert into siblings */
    LY_LIST_NEW_RET(PARSER_CTX(ctx), siblings, any, next, LY_EMEM);

    any->nodetype = any_kw == LY_STMT_ANYDATA ? LYS_ANYDATA : LYS_ANYXML;
    any->parent = parent;

    /* get name */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, any->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_CONFIG:
            LY_CHECK_RET(parse_config(ctx, &any->flags, &any->exts));
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, any->dsc, LY_STMT_DESCRIPTION, 0, &any->dsc, Y_STR_ARG, NULL, &any->exts));
            break;
        case LY_STMT_IF_FEATURE:
            LY_CHECK_RET(parse_qnames(ctx, LY_STMT_IF_FEATURE, &any->iffeatures, Y_STR_ARG, &any->exts));
            break;
        case LY_STMT_MANDATORY:
            LY_CHECK_RET(parse_mandatory(ctx, &any->flags, &any->exts));
            break;
        case LY_STMT_MUST:
            LY_CHECK_RET(parse_restrs(ctx, kw, &any->musts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, any->ref, LY_STMT_REFERENCE, 0, &any->ref, Y_STR_ARG, NULL, &any->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &any->flags, &any->exts));
            break;
        case LY_STMT_WHEN:
            LY_CHECK_RET(parse_when(ctx, &any->when));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, any, any_kw, 0, &any->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), lyplg_ext_stmt2str(any_kw));
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, any->exts, ret, cleanup);
    }

cleanup:
    return ret;
}